

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O2

void dict2pid_dump(FILE *fp,dict2pid_t *d2p,mdef_t *mdef,dict_t *dict)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  fwrite("# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n",0x33,1,(FILE *)fp);
  for (lVar8 = 0; lVar8 < dict->n_word; lVar8 = lVar8 + 1) {
    fprintf((FILE *)fp,"%30s ",dict->word[lVar8].word);
    uVar1 = dict->word[lVar8].pronlen;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      fprintf((FILE *)fp," %5d",(ulong)(uint)d2p->internal[lVar8][uVar6]);
    }
    fputc(10,(FILE *)fp);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# LDIPH_LC (b r l ssid)\n",0x18,1,(FILE *)fp);
  iVar2 = mdef->n_ciphone;
  for (lVar8 = 0; lVar8 < iVar2; lVar8 = lVar8 + 1) {
    for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
      for (lVar9 = 0; lVar9 < iVar2; lVar9 = lVar9 + 1) {
        if (-1 < d2p->ldiph_lc[lVar8][lVar7][lVar9]) {
          pcVar3 = mdef_ciphone_str(mdef,(s3cipid_t)lVar8);
          pcVar4 = mdef_ciphone_str(mdef,(s3cipid_t)lVar7);
          pcVar5 = mdef_ciphone_str(mdef,(s3cipid_t)lVar9);
          fprintf((FILE *)fp,"%6s %6s %6s %5d\n",pcVar3,pcVar4,pcVar5,
                  (ulong)(uint)d2p->ldiph_lc[lVar8][lVar7][lVar9]);
          iVar2 = mdef->n_ciphone;
        }
      }
    }
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# SINGLE_LC (b l comssid)\n",0x1a,1,(FILE *)fp);
  iVar2 = mdef->n_ciphone;
  for (lVar8 = 0; lVar8 < iVar2; lVar8 = lVar8 + 1) {
    for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
      if (-1 < d2p->single_lc[lVar8][lVar7]) {
        pcVar3 = mdef_ciphone_str(mdef,(s3cipid_t)lVar8);
        pcVar4 = mdef_ciphone_str(mdef,(s3cipid_t)lVar7);
        fprintf((FILE *)fp,"%6s %6s %5d\n",pcVar3,pcVar4,(ulong)(uint)d2p->single_lc[lVar8][lVar7]);
        iVar2 = mdef->n_ciphone;
      }
    }
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# SSEQ %d (senid senid ...)\n",(ulong)(uint)mdef->n_sseq);
  for (uVar6 = 0; (long)uVar6 < (long)mdef->n_sseq; uVar6 = uVar6 + 1) {
    fprintf((FILE *)fp,"%5d ",uVar6 & 0xffffffff);
    for (lVar8 = 0; lVar8 < mdef->n_emit_state; lVar8 = lVar8 + 1) {
      fprintf((FILE *)fp," %5d",(ulong)(uint)(int)mdef->sseq[uVar6][lVar8]);
    }
    fputc(10,(FILE *)fp);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# COMSSEQ %d (comstate comstate ...)\n",(ulong)(uint)d2p->n_comsseq);
  for (uVar6 = 0; (long)uVar6 < (long)d2p->n_comsseq; uVar6 = uVar6 + 1) {
    fprintf((FILE *)fp,"%5d ",uVar6 & 0xffffffff);
    for (lVar8 = 0; lVar8 < mdef->n_emit_state; lVar8 = lVar8 + 1) {
      fprintf((FILE *)fp," %5d",(ulong)(uint)(int)d2p->comsseq[uVar6][lVar8]);
    }
    fputc(10,(FILE *)fp);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# COMSTATE %d (senid senid ...)\n",(ulong)(uint)d2p->n_comstate);
  for (uVar6 = 0; (long)uVar6 < (long)d2p->n_comstate; uVar6 = uVar6 + 1) {
    fprintf((FILE *)fp,"%5d ",uVar6 & 0xffffffff);
    for (lVar8 = 0; -1 < *(short *)((long)d2p->comstate[uVar6] + lVar8); lVar8 = lVar8 + 2) {
      fprintf((FILE *)fp," %5d");
    }
    fputc(10,(FILE *)fp);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# END\n",6,1,(FILE *)fp);
  fflush((FILE *)fp);
  return;
}

Assistant:

void
dict2pid_dump(FILE * fp, dict2pid_t * d2p, mdef_t * mdef, dict_t * dict)
{
    int32 w, p, pronlen;
    int32 i, j, b, l, r;

    fprintf(fp, "# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n");
    for (w = 0; w < dict_size(dict); w++) {
        fprintf(fp, "%30s ", dict_wordstr(dict, w));

        pronlen = dict_pronlen(dict, w);
        for (p = 0; p < pronlen; p++)
            fprintf(fp, " %5d", d2p->internal[w][p]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# LDIPH_LC (b r l ssid)\n");
    for (b = 0; b < mdef_n_ciphone(mdef); b++) {
        for (r = 0; r < mdef_n_ciphone(mdef); r++) {
            for (l = 0; l < mdef_n_ciphone(mdef); l++) {
                if (IS_S3SSID(d2p->ldiph_lc[b][r][l]))
                    fprintf(fp, "%6s %6s %6s %5d\n", mdef_ciphone_str(mdef, (s3cipid_t) b), mdef_ciphone_str(mdef, (s3cipid_t) r), mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->ldiph_lc[b][r][l]);      /* RAH, ldiph_lc is returning an int32, %d expects an int16 */
            }
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SINGLE_LC (b l comssid)\n");
    for (b = 0; b < mdef_n_ciphone(mdef); b++) {
        for (l = 0; l < mdef_n_ciphone(mdef); l++) {
            if (IS_S3SSID(d2p->single_lc[b][l]))
                fprintf(fp, "%6s %6s %5d\n", mdef_ciphone_str(mdef, (s3cipid_t) b), mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->single_lc[b][l]);       /* RAH, single_lc is returning an int32, %d expects an int16 */
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SSEQ %d (senid senid ...)\n", mdef->n_sseq);
    for (i = 0; i < mdef->n_sseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", mdef->sseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# COMSSEQ %d (comstate comstate ...)\n", d2p->n_comsseq);
    for (i = 0; i < d2p->n_comsseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", d2p->comsseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# COMSTATE %d (senid senid ...)\n", d2p->n_comstate);
    for (i = 0; i < d2p->n_comstate; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; IS_S3SENID(d2p->comstate[i][j]); j++)
            fprintf(fp, " %5d", d2p->comstate[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");
    fprintf(fp, "# END\n");

    fflush(fp);
}